

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O0

ArenaAllocator * __thiscall
duckdb::WindowSegmentTreeGlobalState::CreateTreeAllocator(WindowSegmentTreeGlobalState *this)

{
  type pAVar1;
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  *in_RDI;
  lock_guard<std::mutex> tree_lock;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
  *in_stack_ffffffffffffffb8;
  Allocator *args;
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
  *in_stack_fffffffffffffff0;
  
  ::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  args = (Allocator *)
         &in_RDI[0x2b].
          super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Allocator::DefaultAllocator();
  make_uniq<duckdb::ArenaAllocator,duckdb::Allocator&>(args);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
            (in_RDI,in_stack_ffffffffffffffb8);
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)0x1a6accc);
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
  ::back(in_stack_fffffffffffffff0);
  pAVar1 = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
           operator*((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                      *)in_stack_ffffffffffffffb0);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a6acff);
  return pAVar1;
}

Assistant:

ArenaAllocator &CreateTreeAllocator() {
		lock_guard<mutex> tree_lock(lock);
		tree_allocators.emplace_back(make_uniq<ArenaAllocator>(Allocator::DefaultAllocator()));
		return *tree_allocators.back();
	}